

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.h
# Opt level: O0

void __thiscall
CTcMakeDef::CTcMakeDef(CTcMakeDef *this,textchar_t *sym,textchar_t *expan,int is_def)

{
  int in_ECX;
  undefined8 *in_RDI;
  CTcMakeStr *this_00;
  CTcMakeStr *in_stack_ffffffffffffffd0;
  
  CTcMakeStr::CTcMakeStr((CTcMakeStr *)(in_RDI + 1));
  this_00 = (CTcMakeStr *)(in_RDI + 2);
  CTcMakeStr::CTcMakeStr(this_00);
  CTcMakeStr::set(in_stack_ffffffffffffffd0,(textchar_t *)this_00);
  CTcMakeStr::set(in_stack_ffffffffffffffd0,(textchar_t *)this_00);
  *(byte *)(in_RDI + 3) = *(byte *)(in_RDI + 3) & 0xfe | in_ECX != 0;
  *in_RDI = 0;
  return;
}

Assistant:

CTcMakeDef(const textchar_t *sym, const textchar_t *expan, int is_def)
    {
        /* remember the symbol and its expansion */
        sym_.set(sym);
        expan_.set(expan);

        /* remember whether it's a definition or un-definition */
        is_def_ = (is_def != 0);

        /* not in a list yet */
        nxt_ = 0;
    }